

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::genAddressRegDst(Instruction *this,ostream *os,int dstIndex)

{
  uint *puVar1;
  ostream *poVar2;
  long *this_00;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = "L1";
  if ((this->mod & 3) == 0) {
    pcVar3 = "L2";
  }
  pcVar4 = "L3";
  if (this->mod < 0xe0) {
    pcVar4 = pcVar3;
  }
  std::operator<<(os,pcVar4);
  poVar2 = std::operator<<(os,"[r");
  this_00 = (long *)std::ostream::operator<<(poVar2,dstIndex);
  puVar1 = (uint *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x18);
  *puVar1 = *puVar1 | 0x800;
  poVar2 = (ostream *)std::ostream::operator<<(this_00,this->imm32);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffff7ff;
  std::operator<<(poVar2,"]");
  return;
}

Assistant:

void Instruction::genAddressRegDst(std::ostream& os, int dstIndex) const {
		if (getModCond() < StoreL3Condition)
			os << (getModMem() ? "L1" : "L2");
		else
			os << "L3";
		os << "[r" << dstIndex << std::showpos << (int32_t)getImm32() << std::noshowpos << "]";
	}